

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively
          (QGraphicsItemPrivate *this,InvalidateReason reason)

{
  long i_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  QGraphicsItemPrivate *pQVar3;
  int in_ESI;
  QGraphicsEffectSourcePrivate *in_RDI;
  QGraphicsItemPrivate *childPrivate;
  int i;
  InvalidateReason reason_00;
  int iVar4;
  
  if ((*(uint *)&in_RDI[2].field_0x48 >> 9 & 1) != 0) {
    iVar4 = 0;
    while( true ) {
      i_00 = (long)iVar4;
      qVar1 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)&in_RDI[1].field_0x8);
      if (qVar1 <= i_00) break;
      ppQVar2 = QList<QGraphicsItem_*>::at((QList<QGraphicsItem_*> *)in_RDI,i_00);
      reason_00 = (InvalidateReason)((ulong)i_00 >> 0x20);
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               data(&(*ppQVar2)->d_ptr);
      if ((in_ESI != 0) || ((*(ulong *)&pQVar3->field_0x160 & 0x4000000000) == 0)) {
        if (pQVar3->graphicsEffect != (QGraphicsEffect *)0x0) {
          *(uint *)&pQVar3->field_0x168 = *(uint *)&pQVar3->field_0x168 & 0xfffffffe | 1;
          QGraphicsEffect::d_func((QGraphicsEffect *)0x97c218);
          QGraphicsEffectSource::d_func((QGraphicsEffectSource *)0x97c221);
          QGraphicsEffectSourcePrivate::invalidateCache(in_RDI,reason_00);
        }
        invalidateChildGraphicsEffectsRecursively
                  ((QGraphicsItemPrivate *)CONCAT44(in_ESI,iVar4),
                   (InvalidateReason)((ulong)pQVar3 >> 0x20));
      }
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively(QGraphicsItemPrivate::InvalidateReason reason)
{
    if (!mayHaveChildWithGraphicsEffect)
        return;

    for (int i = 0; i < children.size(); ++i) {
        QGraphicsItemPrivate *childPrivate = children.at(i)->d_ptr.data();
        if (reason == OpacityChanged && (childPrivate->flags & QGraphicsItem::ItemIgnoresParentOpacity))
            continue;
        if (childPrivate->graphicsEffect) {
            childPrivate->notifyInvalidated = 1;
            static_cast<QGraphicsItemEffectSourcePrivate *>(childPrivate->graphicsEffect->d_func()->source->d_func())->invalidateCache();
        }

        childPrivate->invalidateChildGraphicsEffectsRecursively(reason);
    }
}